

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

size_t __thiscall Fossilize::ConcurrentDatabase::get_total_num_hashes(ConcurrentDatabase *this)

{
  size_t sVar1;
  uint i;
  ResourceTag tag;
  size_t sVar2;
  
  sVar2 = 0;
  for (tag = RESOURCE_APPLICATION_INFO; tag != RESOURCE_COUNT; tag = tag + RESOURCE_SAMPLER) {
    sVar1 = get_total_num_hashes_for_tag(this,tag);
    sVar2 = sVar2 + sVar1;
  }
  return sVar2;
}

Assistant:

size_t get_total_num_hashes() const
	{
		size_t count = 0;
		for (unsigned i = 0; i < RESOURCE_COUNT; i++)
		{
			auto tag = ResourceTag(i);
			count += get_total_num_hashes_for_tag(tag);
		}
		return count;
	}